

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

char * __thiscall
despot::util::tinyxml::TiXmlElement::Attribute(TiXmlElement *this,char *name,int *i)

{
  int iVar1;
  char *__nptr;
  char *s;
  int *i_local;
  char *name_local;
  TiXmlElement *this_local;
  
  __nptr = Attribute(this,name);
  if (i != (int *)0x0) {
    if (__nptr == (char *)0x0) {
      *i = 0;
    }
    else {
      iVar1 = atoi(__nptr);
      *i = iVar1;
    }
  }
  return __nptr;
}

Assistant:

const char* TiXmlElement::Attribute(const char* name, int* i) const {
	const char* s = Attribute(name);
	if (i) {
		if (s) {
			*i = atoi(s);
		} else {
			*i = 0;
		}
	}
	return s;
}